

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O1

ErrorData * __thiscall
duckdb::ART::Append(ErrorData *__return_storage_ptr__,ART *this,IndexLock *l,DataChunk *chunk,
                   Vector *row_ids,IndexAppendInfo *info)

{
  Allocator *allocator;
  DataChunk expr_chunk;
  DataChunk local_70;
  
  DataChunk::DataChunk(&local_70);
  allocator = Allocator::DefaultAllocator();
  DataChunk::Initialize(&local_70,allocator,&(this->super_BoundIndex).logical_types,0x800);
  BoundIndex::ExecuteExpressions(&this->super_BoundIndex,chunk,&local_70);
  (*(this->super_BoundIndex).super_Index._vptr_Index[0xe])
            (__return_storage_ptr__,this,l,&local_70,row_ids,info);
  DataChunk::~DataChunk(&local_70);
  return __return_storage_ptr__;
}

Assistant:

ErrorData ART::Append(IndexLock &l, DataChunk &chunk, Vector &row_ids, IndexAppendInfo &info) {
	// Execute all column expressions before inserting the data chunk.
	DataChunk expr_chunk;
	expr_chunk.Initialize(Allocator::DefaultAllocator(), logical_types);
	ExecuteExpressions(chunk, expr_chunk);

	// Now insert the data chunk.
	return Insert(l, expr_chunk, row_ids, info);
}